

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O2

void brotli::HistogramRemap<brotli::Histogram<256>>
               (Histogram<256> *in,size_t in_size,Histogram<256> *out,uint32_t *symbols)

{
  uint uVar1;
  uint *puVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var3
  ;
  uint *puVar4;
  size_t i_1;
  pointer puVar5;
  size_t i;
  size_t sVar6;
  ulong uVar7;
  Histogram<256> *pHVar8;
  double dVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> all_symbols;
  allocator_type local_69;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  uint *local_50;
  Histogram<256> *local_48;
  double local_40;
  uint *local_38;
  
  local_48 = in;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,symbols,
             symbols + in_size,&local_69);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_68._M_impl.super__Vector_impl_data._M_start,
             local_68._M_impl.super__Vector_impl_data._M_finish);
  _Var3 = std::
          __unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (local_68._M_impl.super__Vector_impl_data._M_start,
                     local_68._M_impl.super__Vector_impl_data._M_finish);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,
             (long)_Var3._M_current - (long)local_68._M_impl.super__Vector_impl_data._M_start >> 2);
  local_50 = symbols;
  for (sVar6 = 0; puVar2 = local_50, puVar4 = local_68._M_impl.super__Vector_impl_data._M_start,
      sVar6 != in_size; sVar6 = sVar6 + 1) {
    puVar4 = local_50 + (sVar6 - 1);
    if (sVar6 == 0) {
      puVar4 = local_50;
    }
    uVar7 = (ulong)*puVar4;
    pHVar8 = local_48 + sVar6;
    local_40 = HistogramBitCostDistance<brotli::Histogram<256>>(pHVar8,out + uVar7);
    local_38 = puVar2 + sVar6;
    for (puVar5 = local_68._M_impl.super__Vector_impl_data._M_start;
        puVar5 != local_68._M_impl.super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
      dVar9 = HistogramBitCostDistance<brotli::Histogram<256>>(pHVar8,out + *puVar5);
      if (dVar9 < local_40) {
        uVar7 = (ulong)*puVar5;
        local_40 = dVar9;
      }
    }
    *local_38 = (uint)uVar7;
  }
  for (; puVar2 = local_50, puVar4 != local_68._M_impl.super__Vector_impl_data._M_finish;
      puVar4 = puVar4 + 1) {
    uVar1 = *puVar4;
    memset(out + uVar1,0,0x408);
    out[uVar1].bit_cost_ = INFINITY;
  }
  pHVar8 = local_48;
  for (sVar6 = 0; in_size != sVar6; sVar6 = sVar6 + 1) {
    Histogram<256>::AddHistogram(out + puVar2[sVar6],pHVar8);
    pHVar8 = pHVar8 + 1;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void HistogramRemap(const HistogramType* in, size_t in_size,
                    HistogramType* out, uint32_t* symbols) {
  // Uniquify the list of symbols.
  std::vector<uint32_t> all_symbols(symbols, symbols + in_size);
  std::sort(all_symbols.begin(), all_symbols.end());
  std::vector<uint32_t>::iterator last =
      std::unique(all_symbols.begin(), all_symbols.end());
  all_symbols.resize(static_cast<size_t>(last - all_symbols.begin()));

  for (size_t i = 0; i < in_size; ++i) {
    uint32_t best_out = i == 0 ? symbols[0] : symbols[i - 1];
    double best_bits = HistogramBitCostDistance(in[i], out[best_out]);
    for (std::vector<uint32_t>::const_iterator k = all_symbols.begin();
         k != all_symbols.end(); ++k) {
      const double cur_bits = HistogramBitCostDistance(in[i], out[*k]);
      if (cur_bits < best_bits) {
        best_bits = cur_bits;
        best_out = *k;
      }
    }
    symbols[i] = best_out;
  }


  // Recompute each out based on raw and symbols.
  for (std::vector<uint32_t>::const_iterator k = all_symbols.begin();
       k != all_symbols.end(); ++k) {
    out[*k].Clear();
  }
  for (size_t i = 0; i < in_size; ++i) {
    out[symbols[i]].AddHistogram(in[i]);
  }
}